

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O2

void __thiscall
gl4cts::DirectStateAccess::TransformFeedback::FunctionalTest::clean(FunctionalTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_xfb_dsa != 0) {
    (**(code **)(lVar2 + 0x488))(1,&this->m_xfb_dsa);
    this->m_xfb_dsa = 0;
  }
  if (this->m_bo != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_bo);
    this->m_bo = 0;
  }
  if (this->m_po != 0) {
    (**(code **)(lVar2 + 0x1680))(0);
    (**(code **)(lVar2 + 0x448))(this->m_po);
    this->m_po = 0;
  }
  if (this->m_vao != 0) {
    (**(code **)(lVar2 + 0xd8))(0);
    (**(code **)(lVar2 + 0x490))(1,&this->m_vao);
    this->m_vao = 0;
  }
  (**(code **)(lVar2 + 0x4e8))(0x8c89);
  return;
}

Assistant:

void FunctionalTest::clean()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Release transform feedback object. */
	if (m_xfb_dsa)
	{
		gl.deleteTransformFeedbacks(1, &m_xfb_dsa);

		m_xfb_dsa = 0;
	}

	/* Release buffer object. */
	if (m_bo)
	{
		gl.deleteBuffers(1, &m_bo);

		m_bo = 0;
	}

	/* Release GLSL program. */
	if (m_po)
	{
		gl.useProgram(0);

		gl.deleteProgram(m_po);

		m_po = 0;
	}

	/* Release vertex array object. */
	if (m_vao)
	{
		gl.bindVertexArray(0);

		gl.deleteVertexArrays(1, &m_vao);

		m_vao = 0;
	}

	/* Returning to default rasterizer state. */
	gl.disable(GL_RASTERIZER_DISCARD);
}